

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 ExtractNonSpaceToken(char **pzIn,char *zEnd,SyString *pOut)

{
  char *pcVar1;
  ushort **ppuVar2;
  bool bVar3;
  char *zPtr;
  char *zIn;
  SyString *pOut_local;
  char *zEnd_local;
  char **pzIn_local;
  
  zPtr = *pzIn;
  while( true ) {
    pcVar1 = zPtr;
    bVar3 = false;
    if ((zPtr < zEnd) && (bVar3 = false, (byte)*zPtr < 0xc0)) {
      ppuVar2 = __ctype_b_loc();
      bVar3 = ((*ppuVar2)[(int)*zPtr] & 0x2000) != 0;
    }
    if (!bVar3) break;
    zPtr = zPtr + 1;
  }
  if (zPtr < zEnd) {
    while( true ) {
      bVar3 = false;
      if ((zPtr < zEnd) && (bVar3 = false, (byte)*zPtr < 0xc0)) {
        ppuVar2 = __ctype_b_loc();
        bVar3 = ((*ppuVar2)[(int)*zPtr] & 0x2000) == 0;
      }
      if (!bVar3) break;
      zPtr = zPtr + 1;
    }
    pOut->zString = pcVar1;
    pOut->nByte = (int)zPtr - (int)pcVar1;
    *pzIn = zPtr;
    pzIn_local._4_4_ = 0;
  }
  else {
    pzIn_local._4_4_ = -0x12;
  }
  return pzIn_local._4_4_;
}

Assistant:

static sxi32 ExtractNonSpaceToken(const char **pzIn, const char *zEnd, SyString *pOut)
{
	const char *zIn = *pzIn;
	const char *zPtr;
	/* Ignore leading white spaces */
	while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && SyisSpace(zIn[0]) ){
		zIn++;
	}
	if( zIn >= zEnd ){
		/* End of input */
		return SXERR_EOF;
	}
	zPtr = zIn;
	/* Extract the token */
	while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && !SyisSpace(zIn[0]) ){
		zIn++;
	}
	SyStringInitFromBuf(pOut, zPtr, zIn-zPtr);
	/* Synchronize pointers */
	*pzIn = zIn;
	/* Return to the caller */
	return SXRET_OK;
}